

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_set_next_stream_id(nghttp2_session *session,int32_t next_stream_id)

{
  int32_t next_stream_id_local;
  nghttp2_session *session_local;
  
  if ((next_stream_id < 1) || ((uint)next_stream_id < session->next_stream_id)) {
    session_local._4_4_ = -0x1f5;
  }
  else {
    if (session->server == '\0') {
      if (next_stream_id % 2 == 0) {
        return -0x1f5;
      }
    }
    else if (next_stream_id % 2 != 0) {
      return -0x1f5;
    }
    session->next_stream_id = next_stream_id;
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_set_next_stream_id(nghttp2_session *session,
                                       int32_t next_stream_id) {
  if (next_stream_id <= 0 ||
      session->next_stream_id > (uint32_t)next_stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (session->server) {
    if (next_stream_id % 2) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }
  } else if (next_stream_id % 2 == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  session->next_stream_id = (uint32_t)next_stream_id;
  return 0;
}